

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.h
# Opt level: O0

void __thiscall dlib::menu_bar::menu_data::menu_data(menu_data *this)

{
  vector<long,_2L> *in_RDI;
  popup_menu *in_stack_00000010;
  vector<long,_2L> *this_00;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_fffffffffffffff0;
  
  this_00 = in_RDI;
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  basic_string(in_stack_fffffffffffffff0);
  in_RDI[2].
  super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>.
  data.data[0] = -1;
  popup_menu::popup_menu(in_stack_00000010);
  rectangle::rectangle((rectangle *)(this_00 + 0x2e));
  rectangle::rectangle((rectangle *)(this_00 + 0x30));
  vector<long,_2L>::vector(this_00);
  vector<long,_2L>::vector(this_00);
  return;
}

Assistant:

menu_data():underline_pos(dlib::ustring::npos){}